

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O0

bool __thiscall DBSCAN::Fit(DBSCAN *this)

{
  bool bVar1;
  reference this_00;
  ostream *poVar2;
  Embedding *emb;
  unsigned_long i;
  int clusterId;
  DBSCAN *this_local;
  
  i._4_4_ = 0;
  for (emb = (Embedding *)0x0; emb < (Embedding *)(ulong)this->emb_num;
      emb = (Embedding *)((long)&emb->emb_id + 1)) {
    this_00 = std::vector<Embedding,_std::allocator<Embedding>_>::operator[]
                        (&this->embs,(size_type)emb);
    bVar1 = Embedding::IsVisited(this_00);
    if ((!bVar1) && (bVar1 = Embedding::IsKey(this_00), bVar1)) {
      Embedding::SetClusterID(this_00,i._4_4_);
      Embedding::SetVisited(this_00,true);
      KeyEmbCluster(this,(uint)emb,i._4_4_);
      i._4_4_ = i._4_4_ + 1;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"cluster ID");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,i._4_4_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return true;
}

Assistant:

bool DBSCAN::Fit()
{
    int clusterId=0;                        //聚类id计数，初始化为0
    for(unsigned long i=0; i<this->emb_num;i++)            //对每一个数据点执行
    {
        Embedding& emb = this->embs[i];                    //取到第i个数据点对象
        if(!emb.IsVisited() && emb.IsKey())            //若对象没被访问过，并且是核心对象执行
        {
            emb.SetClusterID(clusterId);                //设置该对象所属簇ID为clusterId
            emb.SetVisited(true);                    //设置该对象已被访问过
            this->KeyEmbCluster(i, clusterId);            //对该对象领域内点进行聚类
            clusterId++;                            //clusterId自增1
        }
        //cout << "孤立点\T" << i << endl;
    }

    std::cout <<"cluster ID" <<clusterId<<std::endl;        //算法完成后，输出聚类个数
    return true;    //返回
}